

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

char * __thiscall dtc::__xpg_basename(dtc *this,char *__path)

{
  function<char_*(char_*)> local_38;
  string *local_18;
  string *s_local;
  
  local_18 = (string *)__path;
  s_local = (string *)this;
  std::function<char*(char*)>::function<char*(&)(char*)noexcept,void>
            ((function<char*(char*)> *)&local_38,::__xpg_basename);
  anon_unknown_3::dirbasename((string *)this,&local_38,local_18);
  std::function<char_*(char_*)>::~function(&local_38);
  return (char *)this;
}

Assistant:

string basename(const string &s)
{
	return dirbasename(::basename, s);
}